

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

int Gia_ManFaultDumpNewFaults
              (Gia_Man_t *pM,int nFuncVars,Vec_Int_t *vTests,Vec_Int_t *vTestNew,Bmc_ParFf_t *pPars)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAig;
  sat_solver *s;
  Vec_Int_t *p;
  int *__ptr;
  long lVar3;
  abctime aVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  timespec ts;
  timespec local_78;
  Cnf_Dat_t *local_68;
  Gia_Man_t *local_60;
  int local_54;
  Gia_Man_t *local_50;
  Bmc_ParFf_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = pM;
  local_60 = Gia_ManFaultCofactor(pM,vTestNew);
  pAig = Gia_ManToAigSimple(local_60);
  pAig->nRegs = 0;
  local_68 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  s = sat_solver_new();
  sat_solver_setnvars(s,1);
  iVar2 = pPars->nTimeOut;
  if ((long)iVar2 == 0) {
    aVar4 = 0;
  }
  else {
    iVar1 = clock_gettime(3,&local_78);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    aVar4 = lVar3 + (long)iVar2 * 1000000;
  }
  s->nRuntimeLimit = aVar4;
  Gia_ManFaultAddOne(local_50,(Cnf_Dat_t *)0x0,s,vTestNew,nFuncVars,1,(Gia_Man_t *)0x0);
  uVar8 = (long)vTests->nSize / (long)nFuncVars;
  if (vTests->nSize % nFuncVars != 0) {
    __assert_fail("Vec_IntSize(vTests) % nFuncVars == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x530,
                  "int Gia_ManFaultDumpNewFaults(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Bmc_ParFf_t *)"
                 );
  }
  p = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0x10 < (uint)nFuncVars) {
    iVar2 = nFuncVars;
  }
  p->nCap = iVar2;
  __ptr = (int *)malloc((long)iVar2 << 2);
  p->pArray = __ptr;
  if (0 < (int)uVar8) {
    local_40 = (ulong)(uint)nFuncVars;
    uVar6 = 0;
    uVar5 = 0;
    local_54 = nFuncVars;
    local_48 = pPars;
    local_38 = uVar8 & 0xffffffff;
    do {
      uVar9 = (ulong)uVar5;
      p->nSize = 0;
      uVar8 = local_40;
      if (0 < nFuncVars) {
        do {
          if (((int)uVar5 < 0) || (vTests->nSize <= (int)uVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          Vec_IntPush(p,vTests->pArray[uVar9]);
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      nFuncVars = local_54;
      iVar2 = Gia_ManFaultAddOne(local_50,local_68,s,p,local_54,0,local_60);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x53c,
                      "int Gia_ManFaultDumpNewFaults(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Bmc_ParFf_t *)"
                     );
      }
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + nFuncVars;
    } while (uVar6 != local_38);
    __ptr = p->pArray;
    pPars = local_48;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(p);
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  uVar5 = Gia_ManDumpUntests(local_60,local_68,s,nFuncVars,"newfaults.txt",pPars->fVerbose);
  printf("Dumped %d new multiple faults into file \"%s\".  ",(ulong)uVar5,"newfaults.txt");
  iVar1 = 3;
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  Abc_Print(iVar1,"%s =","Time");
  Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar7 + lVar3) / 1000000.0);
  sat_solver_delete(s);
  Cnf_DataFree(local_68);
  Gia_ManStop(local_60);
  return 1;
}

Assistant:

int Gia_ManFaultDumpNewFaults( Gia_Man_t * pM, int nFuncVars, Vec_Int_t * vTests, Vec_Int_t * vTestNew, Bmc_ParFf_t * pPars )
{
    char * pFileName = "newfaults.txt";
    abctime clk;
    Gia_Man_t * pC;
    Cnf_Dat_t * pCnf2;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int i, Iter, IterMax, nNewFaults;

    // derive the cofactor
    pC = Gia_ManFaultCofactor( pM, vTestNew );
    // derive new CNF
    pCnf2 = Cnf_DeriveGiaRemapped( pC );

    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 1 );
    sat_solver_set_runtime_limit( pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    // create the first cofactor
    Gia_ManFaultAddOne( pM, NULL, pSat, vTestNew, nFuncVars, 1, NULL );

    // add other test patterns
    assert( Vec_IntSize(vTests) % nFuncVars == 0 );
    IterMax = Vec_IntSize(vTests) / nFuncVars;
    vLits = Vec_IntAlloc( nFuncVars );
    for ( Iter = 0; Iter < IterMax; Iter++ )
    {
        // get pattern
        Vec_IntClear( vLits );
        for ( i = 0; i < nFuncVars; i++ )
            Vec_IntPush( vLits, Vec_IntEntry(vTests, Iter*nFuncVars + i) );
        // the resulting problem cannot be UNSAT, because the new test is guaranteed 
        // to detect something that the given test set does not detect
        if ( !Gia_ManFaultAddOne( pM, pCnf2, pSat, vLits, nFuncVars, 0, pC ) )
            assert( 0 );
    }
    Vec_IntFree( vLits );

    // dump the new faults
    clk = Abc_Clock();
    nNewFaults = Gia_ManDumpUntests( pC, pCnf2, pSat, nFuncVars, pFileName, pPars->fVerbose );
    printf( "Dumped %d new multiple faults into file \"%s\".  ", nNewFaults, pFileName );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf2 );
    Gia_ManStop( pC );
    return 1;
}